

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doge.cpp
# Opt level: O3

int main(void)

{
  cake_iterator<false> __last1;
  cake_iterator<false> __first2;
  undefined1 auVar1 [24];
  SLNode<int> *pSVar2;
  ostream *poVar3;
  int iVar4;
  int i;
  int iVar5;
  SLNode<int> *pSVar6;
  skiplist<int,_std::less<int>_> s1;
  skiplist<int,_std::less<int>_> s2;
  undefined7 in_stack_ffffffffffffeb89;
  uint7 in_stack_ffffffffffffeba1;
  skiplist<int,_std::less<int>_> local_1438;
  skiplist<int,_std::less<int>_> local_a30;
  
  skiplist<int,_std::less<int>_>::skiplist(&local_1438);
  skiplist<int,_std::less<int>_>::skiplist(&local_a30);
  iVar5 = 0;
  do {
    skiplist<int,_std::less<int>_>::insert(&local_1438,iVar5);
    skiplist<int,_std::less<int>_>::insert(&local_a30,iVar5);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 10);
  *(uint *)(memmove + *(long *)(std::cout + -0x18)) =
       *(uint *)(memmove + *(long *)(std::cout + -0x18)) | 1;
  if ((local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
       super__Vector_impl_data._M_start ==
       local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     (pSVar2 = (*local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start)->next, pSVar2 == (SLNode<int> *)0x0)) {
    pSVar2 = (SLNode<int> *)0x0;
    iVar5 = 0;
  }
  else {
    iVar5 = pSVar2->count + -1;
  }
  if ((local_a30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
       super__Vector_impl_data._M_start ==
       local_a30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     (pSVar6 = (*local_a30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start)->next, pSVar6 == (SLNode<int> *)0x0)) {
    iVar4 = 0;
    pSVar6 = (SLNode<int> *)0x0;
  }
  else {
    iVar4 = pSVar6->count + -1;
  }
  auVar1._4_4_ = iVar4;
  auVar1._0_4_ = iVar4;
  auVar1._8_8_ = (ulong)in_stack_ffffffffffffeba1 << 8;
  auVar1._16_8_ = 0;
  __last1._8_4_ = iVar5;
  __last1._0_8_ = pSVar6;
  __last1._12_4_ = iVar5;
  __last1.node._0_1_ = 0;
  __last1.node._1_7_ = in_stack_ffffffffffffeb89;
  __first2._8_4_ = iVar4;
  __first2._0_8_ = pSVar2;
  __first2._12_4_ = iVar4;
  __first2.node._0_1_ = 0;
  __first2.node._1_7_ = in_stack_ffffffffffffeba1;
  std::__equal<false>::
  equal<skiplist<int,std::less<int>>::cake_iterator<false>,skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar1 << 0x40),__last1,__first2);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pSVar2 = (*local_1438.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start)->next, pSVar2 != (SLNode<int> *)0x0)) {
    iVar4 = pSVar2->count + -1;
    iVar5 = iVar4;
    do {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (pSVar2->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar4 - iVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      if (iVar5 == 0) {
        pSVar2 = pSVar2->next;
        if (pSVar2 == (SLNode<int> *)0x0) {
          iVar5 = 0;
          pSVar2 = (SLNode<int> *)0x0;
        }
        else {
          iVar4 = pSVar2->count + -1;
          iVar5 = iVar4;
        }
      }
      else {
        iVar5 = iVar5 + -1;
      }
    } while ((pSVar2 != (SLNode<int> *)0x0) || (iVar5 != 0));
  }
  skiplist<int,_std::less<int>_>::~skiplist(&local_a30);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1438);
  return 0;
}

Assistant:

int main() {
	skiplist<int> s1;
	skiplist<int> s2;

	for(int i = 0; i < 10; ++i) {
		s1.insert(i);
		s2.insert(i);
	}

	std::cout << std::boolalpha;
	std::cout << std::equal(begin(s1), end(s1), begin(s2)) << "\n";

	// for_each
	std::for_each(begin(s1), end(s1), [](int e) { std::cout << e << "\t"; });
}